

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O2

void lowmc_record_state(lowmc_parameters_t *lowmc,lowmc_key_t *key,mzd_local_t *x,
                       recorded_state_t *state)

{
  uint uVar1;
  uint i;
  ulong uVar2;
  recorded_state_t *prVar3;
  mzd_local_t *pmVar4;
  long lVar5;
  lowmc_partial_round_t *plVar6;
  mzd_local_t y [1];
  mzd_local_t y_3 [1];
  mzd_local_t x_1 [1];
  mzd_local_t local_140;
  mzd_local_t local_120;
  mzd_local_t local_100 [2];
  ulong local_b8;
  ulong local_90;
  ulong local_70;
  
  uVar1 = (uint)lowmc->m | (uint)lowmc->n << 0x10;
  if ((~DAT_001bf10c & 0x20400) != 0) {
    if (uVar1 == 0x100000a) {
      mzd_xor_s128_256(&local_140,x,precomputed_constant_linear_part);
      plVar6 = rounds;
      mzd_addmul_v_s128_256(&local_140,key,precomputed_round_key_matrix_linear_part);
      mzd_mul_v_s128_256_1280(local_100,key,precomputed_round_key_matrix_non_linear_part);
      mzd_xor_s128_1280(local_100,local_100,precomputed_constant_non_linear_part);
      lVar5 = 0;
      for (uVar2 = 0; uVar2 != 0x25; uVar2 = uVar2 + 1) {
        mzd_copy_s128_256((mzd_local_t *)((long)state->state[0].w64 + lVar5),&local_140);
        sbox_layer_10_uint64(local_140.w64 + 3);
        local_140.w64[3] =
             local_140.w64[3] ^
             *(long *)((long)local_100[uVar2 >> 3 & 0x1fffffff].w64 + (ulong)((uint)uVar2 & 6) * 4)
             << (~(byte)lVar5 & 0x20) & 0xffffffff00000000U;
        mzd_mul_v_parity_uint64_256_30(&local_120,&local_140,plVar6->z_matrix);
        mzd_shuffle_256_30(&local_140,plVar6->r_mask);
        mzd_addmul_v_s128_30_256(&local_120,&local_140,plVar6->r_matrix);
        local_140.w64[3] = local_140.w64[3] & 0x3ffffffff;
        mzd_xor_s128_256(&local_140,&local_120,&local_140);
        plVar6 = plVar6 + 1;
        lVar5 = lVar5 + 0x20;
      }
      mzd_copy_s128_256(state[0x25].state,&local_140);
      sbox_layer_10_uint64(local_140.w64 + 3);
      local_140.w64[3] = local_140.w64[3] ^ local_70 & 0xffffffff00000000;
      mzd_mul_v_s128_256(&local_120,&local_140,Z_r);
      mzd_copy_s128_256(&local_140,&local_120);
      prVar3 = state + 0x26;
LAB_00107bd2:
      pmVar4 = &local_140;
    }
    else {
      if (uVar1 == 0x81002b) {
        mzd_copy_s128_256(local_100,x);
        mzd_addmul_v_s128_129(local_100,key,K_0);
        for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 0x20) {
          mzd_copy_s128_256((mzd_local_t *)((long)state->state[0].w64 + lVar5),local_100);
          sbox_s128_lowmc_129_129_4(local_100);
          mzd_mul_v_s128_129(&local_140,local_100,
                             *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar5));
          mzd_xor_s128_256(local_100,&local_140,*(mzd_local_t **)((long)&rounds[0].constant + lVar5)
                          );
          mzd_addmul_v_s128_129(local_100,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar5));
        }
      }
      else {
        if (uVar1 == 0xc0000a) {
          mzd_xor_s128_256(&local_140,x,precomputed_constant_linear_part);
          plVar6 = rounds;
          mzd_addmul_v_s128_192(&local_140,key,precomputed_round_key_matrix_linear_part);
          mzd_mul_v_s128_192_1024(local_100,key,precomputed_round_key_matrix_non_linear_part);
          mzd_xor_s128_1024(local_100,local_100,precomputed_constant_non_linear_part);
          lVar5 = 0;
          for (uVar2 = 0; uVar2 != 0x1d; uVar2 = uVar2 + 1) {
            mzd_copy_s128_256((mzd_local_t *)((long)state->state[0].w64 + lVar5),&local_140);
            sbox_layer_10_uint64(local_140.w64 + 2);
            local_140.w64[2] =
                 local_140.w64[2] ^
                 *(long *)((long)local_100[uVar2 >> 3 & 0x1fffffff].w64 +
                          (ulong)((uint)uVar2 & 6) * 4) << (~(byte)lVar5 & 0x20) &
                 0xffffffff00000000U;
            mzd_mul_v_parity_uint64_192_30(&local_120,&local_140,plVar6->z_matrix);
            mzd_shuffle_192_30(&local_140,plVar6->r_mask);
            mzd_addmul_v_s128_30_192(&local_120,&local_140,plVar6->r_matrix);
            local_140.w64[2] = local_140.w64[2] & 0x3ffffffff;
            mzd_xor_s128_256(&local_140,&local_120,&local_140);
            plVar6 = plVar6 + 1;
            lVar5 = lVar5 + 0x20;
          }
          mzd_copy_s128_256(state[0x1d].state,&local_140);
          sbox_layer_10_uint64(local_140.w64 + 2);
          local_140.w64[2] = local_140.w64[2] ^ local_90 & 0xffffffff00000000;
          mzd_mul_v_s128_192(&local_120,&local_140,Z_r);
          mzd_copy_s128_256(&local_140,&local_120);
          prVar3 = state + 0x1e;
          goto LAB_00107bd2;
        }
        if (uVar1 == 0xc00040) {
          mzd_copy_s128_256(local_100,x);
          mzd_addmul_v_s128_192(local_100,key,K_0);
          for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 0x20) {
            mzd_copy_s128_256((mzd_local_t *)((long)state->state[0].w64 + lVar5),local_100);
            sbox_s128_lowmc_192_192_4(local_100);
            mzd_mul_v_s128_192(&local_140,local_100,
                               *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar5));
            mzd_xor_s128_256(local_100,&local_140,
                             *(mzd_local_t **)((long)&rounds[0].constant + lVar5));
            mzd_addmul_v_s128_192
                      (local_100,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar5));
          }
        }
        else {
          if (uVar1 != 0xff0055) {
            mzd_xor_s128_128(&local_140,x,precomputed_constant_linear_part);
            plVar6 = rounds;
            mzd_addmul_v_s128_128(&local_140,key,precomputed_round_key_matrix_linear_part);
            mzd_mul_v_s128_128_640(local_100,key,precomputed_round_key_matrix_non_linear_part);
            mzd_xor_s128_640(local_100,local_100,precomputed_constant_non_linear_part);
            lVar5 = 0;
            for (uVar2 = 0; uVar2 != 0x13; uVar2 = uVar2 + 1) {
              mzd_copy_s128_128((mzd_local_t *)((long)state->state[0].w64 + lVar5),&local_140);
              sbox_layer_10_uint64(local_140.w64 + 1);
              local_140.w64[1] =
                   local_140.w64[1] ^
                   *(long *)((long)local_100[uVar2 >> 3 & 0x1fffffff].w64 +
                            (ulong)((uint)uVar2 & 6) * 4) << (~(byte)lVar5 & 0x20) &
                   0xffffffff00000000U;
              mzd_mul_v_parity_uint64_128_30(&local_120,&local_140,plVar6->z_matrix);
              mzd_shuffle_128_30(&local_140,plVar6->r_mask);
              mzd_addmul_v_s128_30_128(&local_120,&local_140,plVar6->r_matrix);
              local_140.w64[1] = local_140.w64[1] & 0x3ffffffff;
              mzd_xor_s128_128(&local_140,&local_120,&local_140);
              plVar6 = plVar6 + 1;
              lVar5 = lVar5 + 0x20;
            }
            mzd_copy_s128_128(state[0x13].state,&local_140);
            sbox_layer_10_uint64(local_140.w64 + 1);
            local_140.w64[1] = local_140.w64[1] ^ local_b8 & 0xffffffff00000000;
            mzd_mul_v_s128_128(&local_120,&local_140,Z_r);
            mzd_copy_s128_128(&local_140,&local_120);
            mzd_copy_s128_128(state[0x14].state,&local_140);
            return;
          }
          mzd_copy_s128_256(local_100,x);
          mzd_addmul_v_s128_256(local_100,key,K_0);
          for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 0x20) {
            mzd_copy_s128_256((mzd_local_t *)((long)state->state[0].w64 + lVar5),local_100);
            sbox_s128_lowmc_255_255_4(local_100);
            mzd_mul_v_s128_256(&local_140,local_100,
                               *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar5));
            mzd_xor_s128_256(local_100,&local_140,
                             *(mzd_local_t **)((long)&rounds[0].constant + lVar5));
            mzd_addmul_v_s128_256
                      (local_100,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar5));
          }
        }
      }
      pmVar4 = local_100;
      prVar3 = state + 4;
    }
    mzd_copy_s128_256(prVar3->state,pmVar4);
    return;
  }
  if (uVar1 == 0x100000a) {
    mzd_xor_s256_256(&local_140,x,precomputed_constant_linear_part);
    plVar6 = rounds;
    mzd_addmul_v_s256_256(&local_140,key,precomputed_round_key_matrix_linear_part);
    mzd_mul_v_s256_256_1280(local_100,key,precomputed_round_key_matrix_non_linear_part);
    mzd_xor_s256_1280(local_100,local_100,precomputed_constant_non_linear_part);
    lVar5 = 0;
    for (uVar2 = 0; uVar2 != 0x25; uVar2 = uVar2 + 1) {
      mzd_copy_s256_256((mzd_local_t *)((long)state->state[0].w64 + lVar5),&local_140);
      sbox_layer_10_uint64(local_140.w64 + 3);
      local_140.w64[3] =
           local_140.w64[3] ^
           *(long *)((long)local_100[uVar2 >> 3 & 0x1fffffff].w64 + (ulong)((uint)uVar2 & 6) * 4) <<
           (~(byte)lVar5 & 0x20) & 0xffffffff00000000U;
      mzd_mul_v_parity_s256_256_30(&local_120,&local_140,plVar6->z_matrix);
      mzd_shuffle_pext_256_30(&local_140,plVar6->r_mask);
      mzd_addmul_v_s256_30_256(&local_120,&local_140,plVar6->r_matrix);
      local_140.w64[3] = local_140.w64[3] & 0x3ffffffff;
      mzd_xor_s256_256(&local_140,&local_120,&local_140);
      plVar6 = plVar6 + 1;
      lVar5 = lVar5 + 0x20;
    }
    mzd_copy_s256_256(state[0x25].state,&local_140);
    sbox_layer_10_uint64(local_140.w64 + 3);
    local_140.w64[3] = local_140.w64[3] ^ local_70 & 0xffffffff00000000;
    mzd_mul_v_s256_256(&local_120,&local_140,Z_r);
    mzd_copy_s256_256(&local_140,&local_120);
    prVar3 = state + 0x26;
LAB_00107b5f:
    pmVar4 = &local_140;
  }
  else {
    if (uVar1 == 0x81002b) {
      mzd_copy_s256_256(local_100,x);
      mzd_addmul_v_s256_129(local_100,key,K_0);
      for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 0x20) {
        mzd_copy_s256_256((mzd_local_t *)((long)state->state[0].w64 + lVar5),local_100);
        sbox_s256_lowmc_129_129_4(local_100);
        mzd_mul_v_s256_129(&local_140,local_100,*(mzd_local_t **)((long)&rounds[0].l_matrix + lVar5)
                          );
        mzd_xor_s256_256(local_100,&local_140,*(mzd_local_t **)((long)&rounds[0].constant + lVar5));
        mzd_addmul_v_s256_129(local_100,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar5));
      }
    }
    else {
      if (uVar1 == 0xc0000a) {
        mzd_xor_s256_256(&local_140,x,precomputed_constant_linear_part);
        plVar6 = rounds;
        mzd_addmul_v_s256_192(&local_140,key,precomputed_round_key_matrix_linear_part);
        mzd_mul_v_s256_192_1024(local_100,key,precomputed_round_key_matrix_non_linear_part);
        mzd_xor_s256_1024(local_100,local_100,precomputed_constant_non_linear_part);
        lVar5 = 0;
        for (uVar2 = 0; uVar2 != 0x1d; uVar2 = uVar2 + 1) {
          mzd_copy_s256_256((mzd_local_t *)((long)state->state[0].w64 + lVar5),&local_140);
          sbox_layer_10_uint64(local_140.w64 + 2);
          local_140.w64[2] =
               local_140.w64[2] ^
               *(long *)((long)local_100[uVar2 >> 3 & 0x1fffffff].w64 + (ulong)((uint)uVar2 & 6) * 4
                        ) << (~(byte)lVar5 & 0x20) & 0xffffffff00000000U;
          mzd_mul_v_parity_uint64_192_30(&local_120,&local_140,plVar6->z_matrix);
          mzd_shuffle_pext_192_30(&local_140,plVar6->r_mask);
          mzd_addmul_v_s256_30_192(&local_120,&local_140,plVar6->r_matrix);
          local_140.w64[2] = local_140.w64[2] & 0x3ffffffff;
          mzd_xor_s256_256(&local_140,&local_120,&local_140);
          plVar6 = plVar6 + 1;
          lVar5 = lVar5 + 0x20;
        }
        mzd_copy_s256_256(state[0x1d].state,&local_140);
        sbox_layer_10_uint64(local_140.w64 + 2);
        local_140.w64[2] = local_140.w64[2] ^ local_90 & 0xffffffff00000000;
        mzd_mul_v_s256_192(&local_120,&local_140,Z_r);
        mzd_copy_s256_256(&local_140,&local_120);
        prVar3 = state + 0x1e;
        goto LAB_00107b5f;
      }
      if (uVar1 == 0xc00040) {
        mzd_copy_s256_256(local_100,x);
        mzd_addmul_v_s256_192(local_100,key,K_0);
        for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 0x20) {
          mzd_copy_s256_256((mzd_local_t *)((long)state->state[0].w64 + lVar5),local_100);
          sbox_s256_lowmc_192_192_4(local_100);
          mzd_mul_v_s256_192(&local_140,local_100,
                             *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar5));
          mzd_xor_s256_256(local_100,&local_140,*(mzd_local_t **)((long)&rounds[0].constant + lVar5)
                          );
          mzd_addmul_v_s256_192(local_100,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar5));
        }
      }
      else {
        if (uVar1 != 0xff0055) {
          mzd_xor_s256_128(&local_140,x,precomputed_constant_linear_part);
          plVar6 = rounds;
          mzd_addmul_v_s256_128(&local_140,key,precomputed_round_key_matrix_linear_part);
          mzd_mul_v_s256_128_768(local_100,key,precomputed_round_key_matrix_non_linear_part);
          mzd_xor_s256_768(local_100,local_100,precomputed_constant_non_linear_part);
          lVar5 = 0;
          for (uVar2 = 0; uVar2 != 0x13; uVar2 = uVar2 + 1) {
            mzd_copy_s256_128((mzd_local_t *)((long)state->state[0].w64 + lVar5),&local_140);
            sbox_layer_10_uint64(local_140.w64 + 1);
            local_140.w64[1] =
                 local_140.w64[1] ^
                 *(long *)((long)local_100[uVar2 >> 3 & 0x1fffffff].w64 +
                          (ulong)((uint)uVar2 & 6) * 4) << (~(byte)lVar5 & 0x20) &
                 0xffffffff00000000U;
            mzd_mul_v_parity_uint64_128_30(&local_120,&local_140,plVar6->z_matrix);
            mzd_shuffle_pext_128_30(&local_140,plVar6->r_mask);
            mzd_addmul_v_s256_30_128(&local_120,&local_140,plVar6->r_matrix);
            local_140.w64[1] = local_140.w64[1] & 0x3ffffffff;
            mzd_xor_s256_128(&local_140,&local_120,&local_140);
            plVar6 = plVar6 + 1;
            lVar5 = lVar5 + 0x20;
          }
          mzd_copy_s256_128(state[0x13].state,&local_140);
          sbox_layer_10_uint64(local_140.w64 + 1);
          local_140.w64[1] = local_140.w64[1] ^ local_b8 & 0xffffffff00000000;
          mzd_mul_v_s256_128(&local_120,&local_140,Z_r);
          mzd_copy_s256_128(&local_140,&local_120);
          mzd_copy_s256_128(state[0x14].state,&local_140);
          return;
        }
        mzd_copy_s256_256(local_100,x);
        mzd_addmul_v_s256_256(local_100,key,K_0);
        for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 0x20) {
          mzd_copy_s256_256((mzd_local_t *)((long)state->state[0].w64 + lVar5),local_100);
          sbox_s256_lowmc_255_255_4(local_100);
          mzd_mul_v_s256_256(&local_140,local_100,
                             *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar5));
          mzd_xor_s256_256(local_100,&local_140,*(mzd_local_t **)((long)&rounds[0].constant + lVar5)
                          );
          mzd_addmul_v_s256_256(local_100,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar5));
        }
      }
    }
    pmVar4 = local_100;
    prVar3 = state + 4;
  }
  mzd_copy_s256_256(prVar3->state,pmVar4);
  return;
}

Assistant:

void lowmc_record_state(const lowmc_parameters_t* lowmc, const lowmc_key_t* key,
                        const mzd_local_t* x, recorded_state_t* state) {
  const uint32_t lowmc_id = lowmc_get_id(lowmc);
#if defined(WITH_OPT)
#if defined(WITH_AVX2)
  /* AVX2 enabled instances */
  if (CPU_SUPPORTS_AVX2) {
    switch (lowmc_id) {
      /* Instances with partial Sbox layer */
#if defined(WITH_LOWMC_128_128_20)
    case LOWMC_ID(128, 10):
      lowmc_store_s256_lowmc_128_128_20(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_30)
    case LOWMC_ID(192, 10):
      lowmc_store_s256_lowmc_192_192_30(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_256_256_38)
    case LOWMC_ID(256, 10):
      lowmc_store_s256_lowmc_256_256_38(key, x, state);
      return;
#endif
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_store_s256_lowmc_129_129_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_store_s256_lowmc_192_192_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_store_s256_lowmc_255_255_4(key, x, state);
      return;
#endif
    }
  }
#endif

#if defined(WITH_SSE2) || defined(WITH_NEON)
  /* SSE2/NEON enabled instances */
  if (CPU_SUPPORTS_SSE2 || CPU_SUPPORTS_NEON) {
    switch (lowmc_id) {
      /* Instances with partial Sbox layer */
#if defined(WITH_LOWMC_128_128_20)
    case LOWMC_ID(128, 10):
      lowmc_store_s128_lowmc_128_128_20(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_30)
    case LOWMC_ID(192, 10):
      lowmc_store_s128_lowmc_192_192_30(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_256_256_38)
    case LOWMC_ID(256, 10):
      lowmc_store_s128_lowmc_256_256_38(key, x, state);
      return;
#endif
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_store_s128_lowmc_129_129_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_store_s128_lowmc_192_192_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_store_s128_lowmc_255_255_4(key, x, state);
      return;
#endif
    }
  }
#endif
#endif

#if !defined(NO_UINT64_FALLBACK)
  /* uint64_t implementations */
  switch (lowmc_id) {
    /* Instances with partial Sbox layer */
#if defined(WITH_LOWMC_128_128_20)
  case LOWMC_ID(128, 10):
    lowmc_store_uint64_lowmc_128_128_20(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_192_192_30)
  case LOWMC_ID(192, 10):
    lowmc_store_uint64_lowmc_192_192_30(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_256_256_38)
  case LOWMC_ID(256, 10):
    lowmc_store_uint64_lowmc_256_256_38(key, x, state);
    return;
#endif
    /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
  case LOWMC_ID(129, 43):
    lowmc_store_uint64_lowmc_129_129_4(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_192_192_4)
  case LOWMC_ID(192, 64):
    lowmc_store_uint64_lowmc_192_192_4(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_255_255_4)
  case LOWMC_ID(255, 85):
    lowmc_store_uint64_lowmc_255_255_4(key, x, state);
    return;
#endif
  }
#endif

  UNREACHABLE;
}